

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O3

size_type __thiscall
google::
sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
::erase(sparse_hashtable<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *this,key_type *key)

{
  iterator iVar1;
  iterator iVar2;
  iterator iVar3;
  nonempty_iterator ppcVar4;
  size_type sVar5;
  const_iterator local_c0;
  iterator local_78;
  
  sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
  ::find<char_const*>(&local_78,
                      (sparse_hashtable<char_const*,char_const*,Hasher,Identity,SetKey<char_const*,Identity>,Hasher,Alloc<char_const*,unsigned_long,18446744073709551615ul>>
                       *)this,key);
  ppcVar4 = local_78.pos.col_current;
  iVar3._M_current = local_78.pos.row_current._M_current;
  iVar2._M_current = local_78.pos.row_end._M_current;
  iVar1._M_current = local_78.pos.row_begin._M_current;
  local_c0.ht = local_78.ht;
  local_c0.pos.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_c0.pos.row_end._M_current = local_78.pos.row_end._M_current;
  local_c0.pos.row_current._M_current = local_78.pos.row_current._M_current;
  local_c0.pos.col_current = local_78.pos.col_current;
  local_c0.end.row_begin._M_current = local_78.end.row_begin._M_current;
  local_c0.end.row_end._M_current = local_78.end.row_end._M_current;
  local_c0.end.row_current._M_current = local_78.end.row_current._M_current;
  local_c0.end.col_current = local_78.end.col_current;
  local_78.pos.row_begin._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_start;
  local_78.pos.row_end._M_current =
       (this->table).groups.
       super__Vector_base<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_78.pos.col_current = (nonempty_iterator)0x0;
  local_78.end.col_current = (nonempty_iterator)0x0;
  local_78.ht = this;
  local_78.pos.row_current._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_begin._M_current = local_78.pos.row_begin._M_current;
  local_78.end.row_end._M_current = local_78.pos.row_end._M_current;
  local_78.end.row_current._M_current = local_78.pos.row_end._M_current;
  sparse_hashtable_iterator<const_char_*,_const_char_*,_Hasher,_Identity,_SetKey<const_char_*,_Identity>,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::advance_past_deleted(&local_78);
  if ((((iVar1._M_current == local_78.pos.row_begin._M_current) &&
       (iVar2._M_current == local_78.pos.row_end._M_current)) &&
      (iVar3._M_current == local_78.pos.row_current._M_current)) &&
     ((iVar3._M_current == iVar2._M_current || (ppcVar4 == local_78.pos.col_current)))) {
    sVar5 = 0;
  }
  else {
    set_deleted(this,&local_c0);
    this->num_deleted = this->num_deleted + 1;
    (this->settings).super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
    consider_shrink_ = true;
    sVar5 = 1;
  }
  return sVar5;
}

Assistant:

size_type erase(const key_type& key) {
    // First, double-check we're not erasing delkey.
    assert((!settings.use_deleted() || !equals(key, key_info.delkey)) &&
           "Erasing the deleted key");
    assert(!settings.use_deleted() || !equals(key, key_info.delkey));
    const_iterator pos = find(key);  // shrug: shouldn't need to be const
    if (pos != end()) {
      assert(!test_deleted(pos));  // or find() shouldn't have returned it
      set_deleted(pos);
      ++num_deleted;
      // will think about shrink after next insert
      settings.set_consider_shrink(true);
      return 1;  // because we deleted one thing
    } else {
      return 0;  // because we deleted nothing
    }
  }